

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O3

ON_SubDDisplayParameters *
ON_SubDDisplayParameters::CreateFromDisplayDensity
          (ON_SubDDisplayParameters *__return_storage_ptr__,uint adaptive_subd_display_density)

{
  double dVar1;
  uchar uVar2;
  unsigned_short uVar3;
  bool bVar4;
  Context CVar5;
  bool bVar6;
  uchar uVar7;
  undefined8 uVar8;
  uint uVar9;
  ON__UINT_PTR OVar10;
  ON_Terminator *pOVar11;
  ON_ProgressReporter *pOVar12;
  double dVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  
  if (adaptive_subd_display_density < 7) {
    __return_storage_ptr__->m_terminator = (ON_Terminator *)0x0;
    __return_storage_ptr__->m_progress_reporter = (ON_ProgressReporter *)0x0;
    __return_storage_ptr__->m_reserved6 = 0;
    __return_storage_ptr__->m_reserved7 = 0.0;
    __return_storage_ptr__->m_bDisplayDensityIsAbsolute = false;
    __return_storage_ptr__->m_display_density = '\0';
    __return_storage_ptr__->m_reserved = 0;
    __return_storage_ptr__->m_bControlNetMesh = false;
    __return_storage_ptr__->m_context = Unknown;
    __return_storage_ptr__->m_bComputeCurvature = false;
    __return_storage_ptr__->m_reserved3 = '\0';
    __return_storage_ptr__->m_reserved4 = 0;
    dVar1 = ON_Interval::ZeroToOne.m_t[1];
    __return_storage_ptr__->m_reserved5 = 0;
    (__return_storage_ptr__->m_progress_reporter_interval).m_t[0] = ON_Interval::ZeroToOne.m_t[0];
    (__return_storage_ptr__->m_progress_reporter_interval).m_t[1] = dVar1;
    __return_storage_ptr__->m_display_density = (uchar)adaptive_subd_display_density;
  }
  else {
    ON_SubDIncrementErrorCount();
    dVar13 = Default.m_progress_reporter_interval.m_t[1];
    pOVar12 = Default.m_progress_reporter;
    pOVar11 = Default.m_terminator;
    dVar1 = Default.m_reserved7;
    OVar10 = Default.m_reserved6;
    uVar8 = Default._8_8_;
    uVar15 = Default._0_8_;
    (__return_storage_ptr__->m_progress_reporter_interval).m_t[0] =
         Default.m_progress_reporter_interval.m_t[0];
    (__return_storage_ptr__->m_progress_reporter_interval).m_t[1] = dVar13;
    __return_storage_ptr__->m_terminator = pOVar11;
    __return_storage_ptr__->m_progress_reporter = pOVar12;
    __return_storage_ptr__->m_reserved6 = OVar10;
    __return_storage_ptr__->m_reserved7 = dVar1;
    uVar14 = Default._0_8_;
    Default.m_bDisplayDensityIsAbsolute = SUB81(uVar15,0);
    Default.m_display_density = SUB81(uVar15,1);
    uVar2 = Default.m_display_density;
    Default.m_reserved = SUB82(uVar15,2);
    uVar3 = Default.m_reserved;
    Default.m_bControlNetMesh = SUB81(uVar15,4);
    bVar4 = Default.m_bControlNetMesh;
    Default.m_context = SUB81(uVar15,5);
    CVar5 = Default.m_context;
    Default.m_bComputeCurvature = SUB81(uVar15,6);
    bVar6 = Default.m_bComputeCurvature;
    Default.m_reserved3 = SUB81(uVar15,7);
    uVar7 = Default.m_reserved3;
    __return_storage_ptr__->m_bDisplayDensityIsAbsolute = Default.m_bDisplayDensityIsAbsolute;
    Default._0_8_ = uVar14;
    uVar15 = Default._8_8_;
    __return_storage_ptr__->m_display_density = uVar2;
    __return_storage_ptr__->m_reserved = uVar3;
    __return_storage_ptr__->m_bControlNetMesh = bVar4;
    __return_storage_ptr__->m_context = CVar5;
    __return_storage_ptr__->m_bComputeCurvature = bVar6;
    __return_storage_ptr__->m_reserved3 = uVar7;
    Default.m_reserved4 = (uint)uVar8;
    Default.m_reserved5 = SUB84(uVar8,4);
    uVar9 = Default.m_reserved5;
    __return_storage_ptr__->m_reserved4 = Default.m_reserved4;
    Default._8_8_ = uVar15;
    __return_storage_ptr__->m_reserved5 = uVar9;
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_SubDDisplayParameters ON_SubDDisplayParameters::CreateFromDisplayDensity(
  unsigned int adaptive_subd_display_density
)
{
  if (adaptive_subd_display_density > ON_SubDDisplayParameters::MaximumDensity)
    return ON_SUBD_RETURN_ERROR(ON_SubDDisplayParameters::Default);

  ON_SubDDisplayParameters limit_mesh_parameters;
  limit_mesh_parameters.m_display_density = (unsigned char)adaptive_subd_display_density;
  limit_mesh_parameters.m_bDisplayDensityIsAbsolute = false;
  return limit_mesh_parameters;
}